

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueUInt8::write(PLYValueUInt8 *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  double in_XMM0_Qa;
  
  this->value = (uchar)(int)in_XMM0_Qa;
  sVar1 = std::streambuf::sputc((char)__fd);
  return sVar1;
}

Assistant:

void write(std::streambuf *out, double v) { value=static_cast<unsigned char>(v); out->sputc(static_cast<char>(value)); }